

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  type_conflict5 tVar3;
  bool bVar4;
  long in_RCX;
  long in_RDX;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int in_R8D;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  int end;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff878;
  undefined1 local_764 [220];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff978;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff980;
  undefined1 local_664 [128];
  undefined1 local_5e4 [128];
  undefined1 local_564 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e4;
  undefined1 local_464 [128];
  undefined4 local_3e4;
  undefined1 local_3e0 [128];
  undefined1 local_360 [256];
  long local_260;
  int *local_258;
  long local_250;
  long local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_22c;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  uint local_1a0;
  int local_19c;
  long local_198;
  long local_190;
  undefined8 local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  long local_120;
  undefined1 *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  long local_f0;
  long local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_160 = &local_22c;
  local_19c = in_R8D;
  local_198 = in_RCX;
  local_190 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
  local_238 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6ec563);
  local_250 = *(long *)(in_RDI[5].m_backend.data._M_elems + 0x14);
  local_248._0_4_ = in_RDI[5].m_backend.exp;
  local_248._4_1_ = in_RDI[5].m_backend.neg;
  local_248._5_3_ = *(undefined3 *)&in_RDI[5].m_backend.field_0x75;
  local_260 = *(long *)(in_RDI[5].m_backend.data._M_elems + 0x1a);
  local_1ac = in_RDI[5].m_backend.data._M_elems[0x17];
  local_1a0 = in_RDI[5].m_backend.data._M_elems[0x18];
  while (local_1a0 = local_1a0 - 1, (int)local_1ac <= (int)local_1a0) {
    iVar1 = *(int *)(local_260 + (long)(int)local_1a0 * 4);
    local_240 = local_238 + iVar1;
    local_258 = (int *)(local_250 + (long)iVar1 * 4);
    local_1a8 = *(int *)(local_248 + (long)(int)local_1a0 * 4);
    local_e8 = local_190 + (long)local_1a8 * 0x80;
    local_e0 = &local_22c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_RSI,in_stack_fffffffffffff878);
    local_20 = local_360;
    local_28 = &local_22c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,local_28);
    local_10 = local_360;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffff878);
    local_8 = local_360;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RSI);
    StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_RSI,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff878);
    for (local_1a4 = *(int *)(local_260 + (long)(int)(local_1a0 + 1) * 4); pnVar2 = local_240,
        local_1a8 < local_1a4; local_1a4 = local_1a4 + -1) {
      local_c0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_190 + (long)*local_258 * 0x80);
      local_b8 = local_3e0;
      local_c8 = local_240;
      local_258 = local_258 + 1;
      local_240 = local_240 + 1;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_c9,local_c0,pnVar2);
      local_b0 = local_3e0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
      local_98 = local_3e0;
      local_a0 = local_c0;
      local_a8 = local_c8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_RSI,in_stack_fffffffffffff878,(cpp_dec_float<200U,_int,_void> *)0x6ec840);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator+=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_RSI,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffff878);
    }
    local_3e4 = 0;
    tVar3 = boost::multiprecision::operator==(in_RDI,(int *)in_RSI);
    if (tVar3) {
      StableSum::operator_cast_to_number
                ((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff878);
      local_50 = local_464;
      local_58 = &local_4e4;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,local_58);
      local_40 = local_464;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_RSI,in_stack_fffffffffffff878);
      local_38 = local_464;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RSI);
      local_100 = &local_22c;
      local_108 = local_464;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_RSI,in_stack_fffffffffffff878);
      local_150 = local_564;
      local_158 = &local_22c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_RSI,in_stack_fffffffffffff878);
      local_140 = local_5e4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_RSI,in_stack_fffffffffffff878);
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      if (bVar4) {
        *(int *)(local_198 + (long)local_19c * 4) = local_1a8;
        local_f0 = local_190 + (long)local_1a8 * 0x80;
        local_f8 = &local_22c;
        local_19c = local_19c + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_RSI,in_stack_fffffffffffff878);
      }
    }
    else {
      StableSum::operator_cast_to_number
                ((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff878);
      local_80 = local_664;
      local_88 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_764 + 0x80);
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_89,local_88);
      local_70 = local_664;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_RSI,in_stack_fffffffffffff878);
      local_68 = local_664;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RSI);
      local_110 = &local_22c;
      local_118 = local_664;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_RSI,in_stack_fffffffffffff878);
      tVar3 = boost::multiprecision::operator!=(in_RDI,(int *)in_RSI);
      if (tVar3) {
        local_130 = local_764;
        local_138 = &local_22c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_RSI,in_stack_fffffffffffff878);
      }
      else {
        local_168 = local_764;
        local_170 = &stack0xfffffffffffff890;
        local_178 = 0;
        local_d8 = local_170;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)0x2b2bff2ee48e0530,(double)in_RDI,in_RSI);
      }
      local_120 = local_190 + (long)local_1a8 * 0x80;
      local_128 = local_764;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_RSI,in_stack_fffffffffffff878);
    }
  }
  return local_19c;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}